

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kernel.h
# Opt level: O2

bool __thiscall pugg::Kernel::add_driver(Kernel *this,Driver *driver)

{
  Driver *pDVar1;
  iterator iVar2;
  mapped_type *pmVar3;
  key_type kStack_38;
  
  if (driver != (Driver *)0x0) {
    std::__cxx11::string::string((string *)&kStack_38,(string *)&driver->_server_name);
    iVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pugg::detail::Server>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pugg::detail::Server>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pugg::detail::Server>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pugg::detail::Server>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pugg::detail::Server>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pugg::detail::Server>_>_>
                    *)this,&kStack_38);
    std::__cxx11::string::~string((string *)&kStack_38);
    if ((iVar2._M_node != (_Base_ptr)&this->field_0x8) &&
       ((int)iVar2._M_node[3]._M_color <= driver->_version)) {
      std::__cxx11::string::string((string *)&kStack_38,(string *)&driver->_name);
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<pugg::Driver,_std::default_delete<pugg::Driver>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<pugg::Driver,_std::default_delete<pugg::Driver>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<pugg::Driver,_std::default_delete<pugg::Driver>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<pugg::Driver,_std::default_delete<pugg::Driver>_>_>_>_>
                             *)&iVar2._M_node[3]._M_parent,&kStack_38);
      pDVar1 = (pmVar3->_M_t).
               super___uniq_ptr_impl<pugg::Driver,_std::default_delete<pugg::Driver>_>._M_t.
               super__Tuple_impl<0UL,_pugg::Driver_*,_std::default_delete<pugg::Driver>_>.
               super__Head_base<0UL,_pugg::Driver_*,_false>._M_head_impl;
      (pmVar3->_M_t).super___uniq_ptr_impl<pugg::Driver,_std::default_delete<pugg::Driver>_>._M_t.
      super__Tuple_impl<0UL,_pugg::Driver_*,_std::default_delete<pugg::Driver>_>.
      super__Head_base<0UL,_pugg::Driver_*,_false>._M_head_impl = driver;
      if (pDVar1 != (Driver *)0x0) {
        (*pDVar1->_vptr_Driver[1])();
      }
      std::__cxx11::string::~string((string *)&kStack_38);
      return true;
    }
  }
  return false;
}

Assistant:

bool add_driver(pugg::Driver *driver)
  {
    if (!driver)
      return false;

    auto server_iter = _servers.find(driver->server_name());

    if (server_iter == _servers.end())
      return false;

    if (server_iter->second.min_driver_version > driver->version())
      return false;

    server_iter->second.drivers[driver->name()] = std::unique_ptr<pugg::Driver>(driver);
    return true;
  }